

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

date_t __thiscall
duckdb::TimeBucket::OriginTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginTernaryOperator *this,interval_t bucket_width,date_t ts,date_t origin,
          ValidityMask *mask,idx_t idx)

{
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var2;
  interval_t bucket_width_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  BucketWidthType BVar6;
  date_t dVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  NotImplementedException *this_00;
  int64_t unaff_RBX;
  undefined4 in_register_00000084;
  interval_t bucket_width_01;
  interval_t bucket_width_02;
  string local_58;
  unsigned_long in_stack_ffffffffffffffc8;
  
  p_Var2 = (_Head_base<0UL,_unsigned_long_*,_false> *)CONCAT44(in_register_00000084,origin.days);
  bVar5 = Value::IsFinite<duckdb::date_t>(ts);
  if (!bVar5) {
    _Var9._M_head_impl = p_Var2->_M_head_impl;
    if (_Var9._M_head_impl == (unsigned_long *)0x0) {
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long *)&stack0xffffffffffffffc8);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      _Var9._M_head_impl = p_Var2[2]._M_head_impl;
      p_Var2[1]._M_head_impl = (unsigned_long *)_Var3._M_p;
      p_Var2[2]._M_head_impl = (unsigned_long *)sVar4;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_head_impl);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        }
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (p_Var2 + 1));
      _Var9._M_head_impl =
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      p_Var2->_M_head_impl = _Var9._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    _Var9._M_head_impl[(ulong)mask >> 6] =
         _Var9._M_head_impl[(ulong)mask >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1)
    ;
    return (date_t)0;
  }
  bucket_width_00.micros = unaff_RBX;
  bucket_width_00.months = (int)in_stack_ffffffffffffffc8;
  bucket_width_00.days = (int)(in_stack_ffffffffffffffc8 >> 0x20);
  BVar6 = ClassifyBucketWidthErrorThrow(bucket_width_00);
  if (BVar6 != CONVERTIBLE_TO_MONTHS) {
    if (BVar6 == CONVERTIBLE_TO_MICROS) {
      bucket_width_01.micros._4_4_ = 0;
      bucket_width_01._0_12_ = bucket_width._0_12_;
      dVar7 = OriginWidthConvertibleToMicrosTernaryOperator::
              Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                        ((OriginWidthConvertibleToMicrosTernaryOperator *)this,bucket_width_01,ts,
                         origin);
      return (date_t)dVar7.days;
    }
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Bucket type not implemented for TIME_BUCKET","");
    NotImplementedException::NotImplementedException(this_00,&local_58);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bucket_width_02.micros._4_4_ = 0;
  bucket_width_02._0_12_ = bucket_width._0_12_;
  dVar7 = OriginWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                    ((OriginWidthConvertibleToMonthsTernaryOperator *)this,bucket_width_02,ts,origin
                    );
  return (date_t)dVar7.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin, ValidityMask &mask, idx_t idx) {
			if (!Value::IsFinite(origin)) {
				mask.SetInvalid(idx);
				return TR();
			}
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OriginWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OriginWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}